

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_memprof.c
# Opt level: O0

void memprof_write_cfunc(lj_wbuf *out,uint8_t aevent,GCfunc *fn,lua_State *L,uint32_t *lib_adds)

{
  lj_wbuf *buf;
  long in_RCX;
  lua_State *in_RDX;
  uint8_t in_SIL;
  lj_wbuf *in_RDI;
  uint32_t ostate;
  uint32_t *unaff_retaddr;
  global_State *g;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar1;
  
  buf = (lj_wbuf *)(ulong)*(uint *)(in_RCX + 8);
  uVar1 = (undefined4)buf[7].size;
  *(undefined4 *)&buf[7].size = 0xffffffff;
  lj_symtab_dump_newc(unaff_retaddr,in_RDI,in_SIL,in_RDX);
  *(undefined4 *)&buf[7].size = uVar1;
  lj_wbuf_addbyte(buf,(uint8_t)((uint)uVar1 >> 0x18));
  lj_wbuf_addu64(buf,CONCAT44(uVar1,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

static void memprof_write_cfunc(struct lj_wbuf *out, uint8_t aevent,
				const GCfunc *fn, lua_State *L,
				uint32_t *lib_adds)
{
#if LJ_HASRESOLVER
  /* Check if there are any new libs. */
  /*
  ** XXX: Leaving the `vmstate` unchanged leads to an infinite
  ** recursion, because allocations inside ELF parser are treated
  ** as C-side allocations by memrpof. Setting the `vmstate` to
  ** LJ_VMST_INTERP solves the issue.
  */
  global_State *g = G(L);
  const uint32_t ostate = g->vmstate;
  g->vmstate = ~LJ_VMST_INTERP;
  lj_symtab_dump_newc(lib_adds, out, AEVENT_SYMTAB | ASOURCE_CFUNC, L);
  /* Restore vmstate. */
  g->vmstate = ostate;
#else
  UNUSED(lib_adds);
#endif

  lj_wbuf_addbyte(out, aevent | ASOURCE_CFUNC);
  lj_wbuf_addu64(out, (uintptr_t)fn->c.f);
}